

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O0

bool __thiscall FC_BPNN::setLabel(FC_BPNN *this,vector<double,_std::allocator<double>_> *label)

{
  double dVar1;
  double dVar2;
  size_type sVar3;
  reference pvVar4;
  size_type sVar5;
  ostream *this_00;
  const_reference pvVar6;
  reference pvVar7;
  int local_24;
  int j;
  vector<double,_std::allocator<double>_> *label_local;
  FC_BPNN *this_local;
  
  sVar3 = std::vector<double,_std::allocator<double>_>::size(label);
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::back(&this->layers_value);
  sVar5 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
  if (sVar3 == sVar5) {
    local_24 = 0;
    while( true ) {
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::back(&this->layers_error);
      sVar3 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
      if (sVar3 <= (ulong)(long)local_24) break;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](label,(long)local_24);
      dVar1 = *pvVar6;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::back(&this->layers_value);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_24);
      dVar2 = *pvVar7;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::back(&this->layers_error);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_24);
      *pvVar7 = dVar1 - dVar2;
      local_24 = local_24 + 1;
    }
    this_local._7_1_ = true;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cerr,"Error input!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FC_BPNN::setLabel(const std::vector<double>& label)
{
	if (label.size() != layers_value.back().size()) {
		std::cerr << "Error input!" << std::endl;
		return false;
	}
	for (int j = 0 ; j < layers_error.back().size(); j++) {
		layers_error.back()[j] = label[j] - layers_value.back()[j];
	}
	return true;
}